

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::Convolution1D_x86_avx::create_pipeline(Convolution1D_x86_avx *this,Option *opt)

{
  uint _c;
  _func_int *p_Var1;
  _func_int **pp_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  ulong uVar7;
  int _h;
  undefined4 *puVar8;
  ulong uVar9;
  ulong uVar10;
  undefined4 *puVar11;
  int i;
  ulong uVar12;
  long lVar13;
  undefined4 *puVar14;
  undefined4 *puVar15;
  uint uVar16;
  int p;
  int iVar17;
  long lVar18;
  Mat local_78;
  
  p_Var1 = this->_vptr_Convolution1D_x86_avx[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var1) == 0) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var1);
    uVar9 = (long)*(int *)(&this->field_0xf0 + (long)p_Var1) /
            (long)*(int *)(&this->field_0xd4 + (long)p_Var1);
    uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)(int)_c;
    _h = (int)uVar9;
    if (opt->use_packing_layout == true) {
      uVar16 = (uint)((uVar9 & 3) == 0) * 3 + 1;
      if ((uVar9 & 7) == 0) {
        uVar16 = 8;
      }
      uVar7 = (ulong)((_c & 3) == 0) * 3 + 1;
      if ((_c & 7) == 0) {
        uVar7 = 8;
      }
    }
    else {
      uVar16 = 1;
      uVar7 = 1;
    }
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var1),
                 *(int *)(&this->field_0xd4 + (long)p_Var1),_h,_c,(Allocator *)0x0);
    iVar17 = (int)uVar7;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_avx[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                     (long)(int)uVar16),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]) / iVar17,
                (ulong)(iVar17 * uVar16 * 4),iVar17 * uVar16,(Allocator *)0x0);
    pp_Var2 = this->_vptr_Convolution1D_x86_avx;
    pvVar3 = (this->weight_data_packed).data;
    sVar4 = (this->weight_data_packed).cstep;
    sVar5 = (this->weight_data_packed).elemsize;
    for (uVar9 = 0;
        (long)((iVar17 - 1) + uVar9) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        uVar9 = uVar9 + uVar7) {
      puVar8 = (undefined4 *)
               ((long)(int)((uVar9 & 0xffffffff) / uVar7) * sVar4 * sVar5 + (long)pvVar3);
      pp_Var6 = this->_vptr_Convolution1D_x86_avx;
      for (lVar18 = 0; lVar18 < (long)((long)_h - (ulong)(uVar16 - 1));
          lVar18 = lVar18 + (ulong)uVar16) {
        puVar14 = (undefined4 *)
                  ((local_78.w * lVar18 + uVar9 * local_78.cstep) * local_78.elemsize +
                  (long)local_78.data);
        for (lVar13 = 0; lVar13 < *(int *)(&this->field_0xd4 + (long)pp_Var6[-3]);
            lVar13 = lVar13 + 1) {
          puVar11 = puVar14;
          for (uVar12 = 0; uVar10 = uVar7, puVar15 = puVar11, uVar12 != uVar16; uVar12 = uVar12 + 1)
          {
            while (uVar10 != 0) {
              *puVar8 = *puVar15;
              puVar8 = puVar8 + 1;
              uVar10 = uVar10 - 1;
              puVar15 = (undefined4 *)((long)puVar15 + local_78.cstep * local_78.elemsize);
            }
            puVar11 = (undefined4 *)((long)puVar11 + local_78.elemsize * (long)local_78.w);
          }
          puVar14 = puVar14 + 1;
        }
      }
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}